

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void kj::printStackTraceOnCrash(void)

{
  int iVar1;
  Fault f_1;
  Fault f;
  sigaction action;
  stack_t stack;
  Fault local_e0;
  Fault local_d8;
  undefined8 uStack_d0;
  _union_1457 local_c8;
  undefined8 uStack_c0;
  undefined4 local_40;
  sigaltstack local_28;
  
  local_28.ss_sp = (void *)0x0;
  local_28.ss_flags = 0;
  local_28._12_4_ = 0;
  local_28.ss_size = 0x10000;
  local_28.ss_sp = mmap((void *)0x0,0x10000,3,0x122,-1,0);
  do {
    iVar1 = sigaltstack(&local_28,(sigaltstack *)0x0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_d8.exception = (Exception *)0x0;
    local_c8.sa_handler = (__sighandler_t)0x0;
    uStack_c0 = 0;
    _::Debug::Fault::init
              (&local_d8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_d8);
  }
  memset(&local_c8,0,0x98);
  local_40 = 0xc8000004;
  local_c8.sa_handler = anon_unknown_52::crashHandler;
  do {
    iVar1 = sigaction(0xb,(sigaction *)&local_c8,(sigaction *)0x0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_e0.exception = (Exception *)0x0;
    local_d8.exception = (Exception *)0x0;
    uStack_d0 = 0;
    _::Debug::Fault::init
              (&local_e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_e0);
  }
  do {
    iVar1 = sigaction(7,(sigaction *)&local_c8,(sigaction *)0x0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_e0.exception = (Exception *)0x0;
    local_d8.exception = (Exception *)0x0;
    uStack_d0 = 0;
    _::Debug::Fault::init
              (&local_e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_e0);
  }
  do {
    iVar1 = sigaction(8,(sigaction *)&local_c8,(sigaction *)0x0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_e0.exception = (Exception *)0x0;
    local_d8.exception = (Exception *)0x0;
    uStack_d0 = 0;
    _::Debug::Fault::init
              (&local_e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_e0);
  }
  do {
    iVar1 = sigaction(6,(sigaction *)&local_c8,(sigaction *)0x0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_e0.exception = (Exception *)0x0;
    local_d8.exception = (Exception *)0x0;
    uStack_d0 = 0;
    _::Debug::Fault::init
              (&local_e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_e0);
  }
  do {
    iVar1 = sigaction(4,(sigaction *)&local_c8,(sigaction *)0x0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_e0.exception = (Exception *)0x0;
    local_d8.exception = (Exception *)0x0;
    uStack_d0 = 0;
    _::Debug::Fault::init
              (&local_e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_e0);
  }
  do {
    iVar1 = sigaction(0x1f,(sigaction *)&local_c8,(sigaction *)0x0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_e0.exception = (Exception *)0x0;
    local_d8.exception = (Exception *)0x0;
    uStack_d0 = 0;
    _::Debug::Fault::init
              (&local_e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_e0);
  }
  return;
}

Assistant:

void printStackTraceOnCrash() {
  // Set up alternate signal stack so that stack overflows can be handled.
  stack_t stack;
  memset(&stack, 0, sizeof(stack));

#ifndef MAP_ANONYMOUS
#define MAP_ANONYMOUS MAP_ANON
#endif
#ifndef MAP_GROWSDOWN
#define MAP_GROWSDOWN 0
#endif

  stack.ss_size = 65536;
  // Note: ss_sp is char* on FreeBSD, void* on Linux and OSX.
  stack.ss_sp = reinterpret_cast<char*>(mmap(
      nullptr, stack.ss_size, PROT_READ | PROT_WRITE,
      MAP_ANONYMOUS | MAP_PRIVATE | MAP_GROWSDOWN, -1, 0));
  KJ_SYSCALL(sigaltstack(&stack, nullptr));

  // Catch all relevant signals.
  struct sigaction action;
  memset(&action, 0, sizeof(action));

  action.sa_flags = SA_SIGINFO | SA_ONSTACK | SA_NODEFER | SA_RESETHAND;
  action.sa_sigaction = &crashHandler;

  // Dump stack on common "crash" signals.
  KJ_SYSCALL(sigaction(SIGSEGV, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGBUS, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGFPE, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGABRT, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGILL, &action, nullptr));

  // Dump stack on unimplemented syscalls -- useful in seccomp sandboxes.
  KJ_SYSCALL(sigaction(SIGSYS, &action, nullptr));

#ifdef KJ_DEBUG
  // Dump stack on keyboard interrupt -- useful for infinite loops. Only in debug mode, though,
  // because stack traces on ctrl+c can be obnoxious for, say, command-line tools.
  KJ_SYSCALL(sigaction(SIGINT, &action, nullptr));
#endif
}